

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transcode_utils.h
# Opt level: O2

void __thiscall
ktx::OptionsTranscodeTarget<true>::process
          (OptionsTranscodeTarget<true> *this,Options *param_1,ParseResult *args,Reporter *report)

{
  size_t sVar1;
  int iVar2;
  OptionValue *pOVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  const_iterator cVar5;
  long lVar6;
  string argStr;
  undefined1 local_303;
  undefined1 local_302;
  undefined1 local_301;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_300;
  string local_2f8;
  string local_2d8;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_2b8;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_2b0;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_2a8;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_2a0;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_298;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_290;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_288;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_280;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_278;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_270;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_268;
  pair<ktx_transcode_fmt_e,_unsigned_int> local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_258;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_208;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_190;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_140;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_118;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
  local_50;
  
  if (process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::targets_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                                 targets_abi_cxx11_);
    if (iVar2 != 0) {
      local_2f8._M_dataplus._M_p = (pointer)0x0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
      ::pair<const_char_(&)[8],_true>
                (&local_258,(char (*) [8])"etc-rgb",
                 (pair<ktx_transcode_fmt_e,_unsigned_int> *)&local_2f8);
      local_300.first = KTX_TTF_ETC2_RGBA;
      local_300.second = 0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
      ::pair<const_char_(&)[9],_true>(&local_230,(char (*) [9])"etc-rgba",&local_300);
      local_260.first = KTX_TTF_ETC2_EAC_R11;
      local_260.second = 0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
      ::pair<const_char_(&)[8],_true>(&local_208,(char (*) [8])"eac-r11",&local_260);
      local_268.first = KTX_TTF_ETC2_EAC_RG11;
      local_268.second = 0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
      ::pair<const_char_(&)[9],_true>(&local_1e0,(char (*) [9])"eac-rg11",&local_268);
      local_270.first = KTX_TF_BC1;
      local_270.second = 0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
      ::pair<const_char_(&)[4],_true>(&local_1b8,(char (*) [4])"bc1",&local_270);
      local_278.first = KTX_TF_BC3;
      local_278.second = 0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
      ::pair<const_char_(&)[4],_true>(&local_190,(char (*) [4])"bc3",&local_278);
      local_280.first = KTX_TF_BC4;
      local_280.second = 0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
      ::pair<const_char_(&)[4],_true>(&local_168,(char (*) [4])"bc4",&local_280);
      local_288.first = KTX_TF_BC5;
      local_288.second = 0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
      ::pair<const_char_(&)[4],_true>(&local_140,(char (*) [4])"bc5",&local_288);
      local_290.first = KTX_TF_BC7_M6_OPAQUE_ONLY;
      local_290.second = 0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
      ::pair<const_char_(&)[4],_true>(&local_118,(char (*) [4])"bc7",&local_290);
      local_298.first = KTX_TTF_ASTC_4x4_RGBA;
      local_298.second = 0;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
      ::pair<const_char_(&)[5],_true>(&local_f0,(char (*) [5])0x1d6007,&local_298);
      local_2a0.first = KTX_TTF_RGBA32;
      local_2a0.second = 1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
      ::pair<const_char_(&)[3],_true>(&local_c8,(char (*) [3])"r8",&local_2a0);
      local_2a8.first = KTX_TTF_RGBA32;
      local_2a8.second = 2;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
      ::pair<const_char_(&)[4],_true>(&local_a0,(char (*) [4])"rg8",&local_2a8);
      local_2b0.first = KTX_TTF_RGBA32;
      local_2b0.second = 3;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
      ::pair<const_char_(&)[5],_true>(&local_78,(char (*) [5])"rgb8",&local_2b0);
      local_2b8.first = KTX_TTF_RGBA32;
      local_2b8.second = 4;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>
      ::pair<const_char_(&)[6],_true>(&local_50,(char (*) [6])"rgba8",&local_2b8);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<ktx_transcode_fmt_e,unsigned_int>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<ktx_transcode_fmt_e,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _Hashtable<std::pair<std::__cxx11::string_const,std::pair<ktx_transcode_fmt_e,unsigned_int>>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<ktx_transcode_fmt_e,unsigned_int>>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<ktx_transcode_fmt_e,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                     targets_abi_cxx11_,&local_258,&stack0xffffffffffffffd8,0,&local_301,&local_302,
                 &local_303);
      lVar6 = 0x208;
      do {
        std::__cxx11::string::~string((string *)((long)&local_258.first._M_dataplus._M_p + lVar6));
        lVar6 = lVar6 + -0x28;
      } while (lVar6 != -0x28);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>_>_>
                   ::~unordered_map,
                   &process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                    targets_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                           targets_abi_cxx11_);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"target",(allocator<char> *)&local_2f8);
  pOVar3 = cxxopts::ParseResult::operator[](args,&local_258.first);
  sVar1 = pOVar3->m_count;
  std::__cxx11::string::~string((string *)&local_258);
  if (sVar1 != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"target",(allocator<char> *)&local_300);
    pOVar3 = cxxopts::ParseResult::operator[](args,&local_2f8);
    pbVar4 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar3);
    std::__cxx11::string::string((string *)&local_2d8,(string *)pbVar4);
    to_lower_copy(&local_258.first,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
    cVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&process(cxxopts::Options&,cxxopts::ParseResult&,ktx::Reporter&)::
                    targets_abi_cxx11_._M_h,&local_258.first);
    if (cVar5.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      Reporter::fatal_usage<char_const(&)[32],std::__cxx11::string_const&>
                (report,(char (*) [32])"Invalid transcode target: \"{}\".",&local_258.first);
    }
    (this->transcodeTarget).super__Optional_base<ktx_transcode_fmt_e,_true,_true>._M_payload.
    super__Optional_payload_base<ktx_transcode_fmt_e> =
         (_Optional_payload_base<ktx_transcode_fmt_e>)
         ((ulong)*(uint *)((long)cVar5.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>,_true>
                                 ._M_cur + 0x28) | 0x100000000);
    std::__cxx11::string::_M_assign((string *)&this->transcodeTargetName);
    this->transcodeSwizzleComponents =
         *(uint32_t *)
          ((long)cVar5.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<ktx_transcode_fmt_e,_unsigned_int>_>,_true>
                 ._M_cur + 0x2c);
    std::__cxx11::string::~string((string *)&local_258);
  }
  return;
}

Assistant:

void process(cxxopts::Options&, cxxopts::ParseResult& args, Reporter& report) {
        // "transcode" command - optional "target" argument
        // "extract" command - optional "transcode" argument
        const auto argName = TRANSCODE_CMD ? "target" : "transcode";

        static const std::unordered_map<std::string, std::pair<ktx_transcode_fmt_e, uint32_t>> targets{
            {"etc-rgb", {KTX_TTF_ETC1_RGB, 0}},
            {"etc-rgba", {KTX_TTF_ETC2_RGBA, 0}},
            {"eac-r11", {KTX_TTF_ETC2_EAC_R11, 0}},
            {"eac-rg11", {KTX_TTF_ETC2_EAC_RG11, 0}},
            {"bc1", {KTX_TTF_BC1_RGB, 0}},
            {"bc3", {KTX_TTF_BC3_RGBA, 0}},
            {"bc4", {KTX_TTF_BC4_R, 0}},
            {"bc5", {KTX_TTF_BC5_RG, 0}},
            {"bc7", {KTX_TTF_BC7_RGBA, 0}},
            {"astc", {KTX_TTF_ASTC_4x4_RGBA, 0}},
            {"r8", {KTX_TTF_RGBA32, 1}},
            {"rg8", {KTX_TTF_RGBA32, 2}},
            {"rgb8", {KTX_TTF_RGBA32, 3}},
            {"rgba8", {KTX_TTF_RGBA32, 4}},
        };
        if (args[argName].count()) {
            const auto argStr = to_lower_copy(args[argName].as<std::string>());
            const auto it = targets.find(argStr);
            if (it == targets.end())
                report.fatal_usage("Invalid transcode target: \"{}\".", argStr);

            transcodeTarget = it->second.first;
            transcodeTargetName = argStr;
            transcodeSwizzleComponents = it->second.second;
        }
    }